

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool MeCab::Viterbi::buildAlternative(Lattice *lattice)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  long *in_RDI;
  Node *anode;
  size_t pos;
  Node *node;
  Node *bos_node;
  Node **begin_node_list;
  long local_30;
  long local_20;
  
  lVar4 = (**(code **)(*in_RDI + 0x20))();
  for (local_20 = (**(code **)(*in_RDI + 0x10))(); local_20 != 0; local_20 = *(long *)(local_20 + 8)
      ) {
    if ((*(char *)(local_20 + 0x4f) != '\x02') && (*(char *)(local_20 + 0x4f) != '\x03')) {
      lVar3 = *(long *)(local_20 + 0x30);
      lVar5 = (**(code **)(*in_RDI + 0x40))();
      uVar1 = *(ushort *)(local_20 + 0x46);
      uVar2 = *(ushort *)(local_20 + 0x44);
      std::ostream::write((char *)&std::cout,*(long *)(local_20 + 0x30));
      poVar6 = std::operator<<((ostream *)&std::cout,"\t");
      poVar6 = std::operator<<(poVar6,*(char **)(local_20 + 0x38));
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      for (local_30 = *(long *)(lVar4 + (((lVar3 - lVar5) - (ulong)uVar1) + (ulong)uVar2) * 8);
          local_30 != 0; local_30 = *(long *)(local_30 + 0x18)) {
        if ((*(short *)(local_30 + 0x46) == *(short *)(local_20 + 0x46)) &&
           (*(short *)(local_30 + 0x44) == *(short *)(local_20 + 0x44))) {
          std::operator<<((ostream *)&std::cout,"@ ");
          std::ostream::write((char *)&std::cout,*(long *)(local_30 + 0x30));
          poVar6 = std::operator<<((ostream *)&std::cout,"\t");
          poVar6 = std::operator<<(poVar6,*(char **)(local_30 + 0x38));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"EOS");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return true;
}

Assistant:

bool Viterbi::buildAlternative(Lattice *lattice) {
  Node **begin_node_list = lattice->begin_nodes();

  const Node *bos_node = lattice->bos_node();
  for (const Node *node = bos_node; node; node = node->next) {
    if (node->stat == MECAB_BOS_NODE || node->stat == MECAB_EOS_NODE) {
      continue;
    }
    const size_t pos = node->surface - lattice->sentence() -
        node->rlength + node->length;
    std::cout.write(node->surface, node->length);
    std::cout << "\t" << node->feature << std::endl;
    for (const Node *anode = begin_node_list[pos];
         anode; anode = anode->bnext) {
      if (anode->rlength == node->rlength &&
          anode->length == node->length) {
        std::cout << "@ ";
        std::cout.write(anode->surface, anode->length);
        std::cout << "\t" << anode->feature << std::endl;
      }
    }
  }

  std::cout << "EOS" << std::endl;

  return true;
}